

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessageTest.cpp
# Opt level: O2

void __thiscall
AssertionMessageTest_pointerTest_Test::TestBody(AssertionMessageTest_pointerTest_Test *this)

{
  char *message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  AssertionResult gtest_ar;
  string local_50;
  void *ptr;
  string expectedMessage;
  
  ptr = (void *)0xa;
  std::__cxx11::string::string
            ((string *)&expectedMessage,"0x000000000000000a",(allocator *)&local_50);
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_70);
  cppassert::internal::AssertionMessage::operator<<((AssertionMessage *)&local_70,&ptr);
  cppassert::internal::AssertionMessage::str_abi_cxx11_(&local_50,(AssertionMessage *)&local_70);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"expectedMessage","message.str()",&expectedMessage,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionMessageTest.cpp"
               ,0x6d,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&expectedMessage);
  return;
}

Assistant:

TEST(AssertionMessageTest, pointerTest)
{
    void *ptr = (void *)(0x0000000a);
    const std::string expectedMessage((sizeof(void *)==8  ? "0x000000000000000a" :  "0x0000000a" ));
    cppassert::internal::AssertionMessage message;
    message<<ptr;
    EXPECT_EQ(expectedMessage, message.str());
}